

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::extAddPairwiseToUI16x8(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *in_RDX;
  Literal *this_local;
  
  extAddPairwise<8,unsigned_char,short>(__return_storage_ptr__,(wasm *)this,in_RDX);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extAddPairwiseToUI16x8() const {
  return extAddPairwise<8, uint8_t, int16_t>(*this);
}